

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::crc_internal::CRC32::Extend(CRC32 *this,uint32_t *crc,void *bytes,size_t length)

{
  byte *pbVar1;
  uint32_t w;
  uint32_t crc_in;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  uint32_t buf3;
  uint32_t buf2;
  uint32_t buf1;
  anon_class_8_1_8991fb9c combine_one_word;
  anon_class_8_1_8991fb9c step_swath;
  anon_class_48_6_9aa8aeb9 step_stride;
  uint32_t local_98;
  uint32_t local_94;
  uint32_t local_90;
  uint local_8c;
  byte *local_88;
  anon_class_8_1_8991fb9c local_80;
  CRC32 *local_78;
  uint *local_70;
  anon_class_8_1_8991fb9c local_68;
  anon_class_48_6_9aa8aeb9 local_60;
  
  local_60.buf3 = &local_98;
  pbVar1 = (byte *)((long)bytes + length);
  uVar4 = *crc;
  if (0xf < length) {
    local_8c = uVar4 ^ *bytes;
    local_60.buf0 = &local_8c;
    local_90 = *(uint32_t *)((long)bytes + 4);
    local_60.buf1 = &local_90;
    local_94 = *(uint32_t *)((long)bytes + 8);
    local_60.buf2 = &local_94;
    local_98 = *(uint32_t *)((long)bytes + 0xc);
    local_88 = (byte *)((long)bytes + 0x10);
    local_60.p = &local_88;
    local_60.step_swath = &local_68;
    local_70 = crc;
    local_68.this = this;
    while (0x100 < (long)pbVar1 - (long)local_88) {
      Extend::anon_class_48_6_9aa8aeb9::operator()(&local_60);
      Extend::anon_class_48_6_9aa8aeb9::operator()(&local_60);
      Extend::anon_class_48_6_9aa8aeb9::operator()(&local_60);
      Extend::anon_class_48_6_9aa8aeb9::operator()(&local_60);
    }
    local_78 = this;
    while (uVar5 = (long)pbVar1 - (long)local_88, 0xf < uVar5) {
      Extend::anon_class_48_6_9aa8aeb9::operator()(&local_60);
    }
    for (; this = local_78, bytes = local_88, uVar2 = local_90, uVar3 = local_94, w = local_98,
        3 < uVar5; uVar5 = uVar5 - 4) {
      local_98 = Extend::anon_class_8_1_8991fb9c::operator()(&local_68,local_8c,local_88);
      local_88 = (byte *)((long)bytes + 4);
      local_94 = w;
      local_90 = uVar3;
      local_8c = uVar2;
    }
    local_80.this = local_78;
    crc_in = Extend::anon_class_8_1_8991fb9c::operator()(&local_80,0,local_8c);
    uVar2 = Extend::anon_class_8_1_8991fb9c::operator()(&local_80,crc_in,uVar2);
    uVar3 = Extend::anon_class_8_1_8991fb9c::operator()(&local_80,uVar2,uVar3);
    uVar4 = Extend::anon_class_8_1_8991fb9c::operator()(&local_80,uVar3,w);
    crc = local_70;
  }
  for (; (byte *)bytes != pbVar1; bytes = (void *)((long)bytes + 1)) {
    uVar4 = uVar4 >> 8 ^ this->table0_[(uint)*bytes ^ uVar4 & 0xff];
  }
  *crc = uVar4;
  return;
}

Assistant:

void CRC32::Extend(uint32_t* crc, const void* bytes, size_t length) const {
  const uint8_t* p = static_cast<const uint8_t*>(bytes);
  const uint8_t* e = p + length;
  uint32_t l = *crc;

  auto step_one_byte = [this, &p, &l]() {
    int c = (l & 0xff) ^ *p++;
    l = this->table0_[c] ^ (l >> 8);
  };

  if (kNeedAlignedLoads) {
    // point x at first 4-byte aligned byte in string. this might be past the
    // end of the string.
    const uint8_t* x = RoundUp<4>(p);
    if (x <= e) {
      // Process bytes until finished or p is 4-byte aligned
      while (p != x) {
        step_one_byte();
      }
    }
  }

  const size_t kSwathSize = 16;
  if (static_cast<size_t>(e - p) >= kSwathSize) {
    // Load one swath of data into the operating buffers.
    uint32_t buf0 = absl::little_endian::Load32(p) ^ l;
    uint32_t buf1 = absl::little_endian::Load32(p + 4);
    uint32_t buf2 = absl::little_endian::Load32(p + 8);
    uint32_t buf3 = absl::little_endian::Load32(p + 12);
    p += kSwathSize;

    // Increment a CRC value by a "swath"; this combines the four bytes
    // starting at `ptr` and twelve zero bytes, so that four CRCs can be
    // built incrementally and combined at the end.
    const auto step_swath = [this](uint32_t crc_in, const std::uint8_t* ptr) {
      return absl::little_endian::Load32(ptr) ^
             this->table_[3][crc_in & 0xff] ^
             this->table_[2][(crc_in >> 8) & 0xff] ^
             this->table_[1][(crc_in >> 16) & 0xff] ^
             this->table_[0][crc_in >> 24];
    };

    // Run one CRC calculation step over all swaths in one 16-byte stride
    const auto step_stride = [&]() {
      buf0 = step_swath(buf0, p);
      buf1 = step_swath(buf1, p + 4);
      buf2 = step_swath(buf2, p + 8);
      buf3 = step_swath(buf3, p + 12);
      p += 16;
    };

    // Process kStride interleaved swaths through the data in parallel.
    while ((e - p) > kPrefetchHorizon) {
      PrefetchToLocalCacheNta(
          reinterpret_cast<const void*>(p + kPrefetchHorizon));
      // Process 64 bytes at a time
      step_stride();
      step_stride();
      step_stride();
      step_stride();
    }
    while (static_cast<size_t>(e - p) >= kSwathSize) {
      step_stride();
    }

    // Now advance one word at a time as far as possible. This isn't worth
    // doing if we have word-advance tables.
    while (static_cast<size_t>(e - p) >= 4) {
      buf0 = step_swath(buf0, p);
      uint32_t tmp = buf0;
      buf0 = buf1;
      buf1 = buf2;
      buf2 = buf3;
      buf3 = tmp;
      p += 4;
    }

    // Combine the results from the different swaths. This is just a CRC
    // on the data values in the bufX words.
    auto combine_one_word = [this](uint32_t crc_in, uint32_t w) {
      w ^= crc_in;
      for (size_t i = 0; i < 4; ++i) {
        w = (w >> 8) ^ this->table0_[w & 0xff];
      }
      return w;
    };

    l = combine_one_word(0, buf0);
    l = combine_one_word(l, buf1);
    l = combine_one_word(l, buf2);
    l = combine_one_word(l, buf3);
  }

  // Process the last few bytes
  while (p != e) {
    step_one_byte();
  }

  *crc = l;
}